

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PopStyleVar(int count)

{
  int iVar1;
  ImGuiStyleMod *pIVar2;
  ImGuiContext *pIVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  pIVar3 = GImGui;
  iVar6 = (GImGui->StyleVarStack).Size;
  if (iVar6 < count) {
    count = iVar6;
  }
  if (0 < count) {
    iVar6 = count + 1;
    do {
      pIVar2 = (pIVar3->StyleVarStack).Data;
      lVar4 = (long)(pIVar3->StyleVarStack).Size;
      iVar1 = pIVar2[lVar4 + -1].VarIdx;
      if (GStyleVarInfo[iVar1].Type == 8) {
        uVar5 = (ulong)GStyleVarInfo[iVar1].Offset;
        if (GStyleVarInfo[iVar1].Count == 1) {
          *(int *)((long)&(pIVar3->Style).Alpha + uVar5) = pIVar2[lVar4 + -1].field_1.BackupInt[0];
        }
        else if (GStyleVarInfo[iVar1].Count == 2) {
          *(int *)((long)&(pIVar3->Style).Alpha + uVar5) = pIVar2[lVar4 + -1].field_1.BackupInt[0];
          *(int *)((long)&(pIVar3->Style).DisabledAlpha + uVar5) =
               pIVar2[lVar4 + -1].field_1.BackupInt[1];
        }
      }
      (pIVar3->StyleVarStack).Size = (pIVar3->StyleVarStack).Size + -1;
      iVar6 = iVar6 + -1;
    } while (1 < iVar6);
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    if (g.StyleVarStack.Size < count)
    {
        IM_ASSERT_USER_ERROR(g.StyleVarStack.Size > count, "Calling PopStyleVar() too many times: stack underflow.");
        count = g.StyleVarStack.Size;
    }
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}